

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testiconv.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  void *__ptr;
  void *__s1;
  char *__s;
  int local_20dc;
  char *local_20d0;
  size_t len;
  int errors;
  FILE *file;
  int i;
  char *test [2];
  char *ucs4;
  char buffer [8192];
  char *fname;
  char *formats [12];
  char **argv_local;
  int argc_local;
  
  formats[0xb] = (char *)argv;
  memcpy(&fname,&PTR_anon_var_dwarf_23_00103d60,0x60);
  len._4_4_ = 0;
  if (argc < 2) {
    local_20d0 = "utf8.txt";
  }
  else {
    local_20d0 = *(char **)(formats[0xb] + 8);
  }
  __stream = fopen(local_20d0,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Unable to open %s\n",local_20d0);
    argv_local._4_4_ = 1;
  }
  else {
    while (pcVar2 = fgets((char *)&ucs4,0x2000,__stream), pcVar2 != (char *)0x0) {
      sVar3 = strlen((char *)&ucs4);
      pcVar2 = (char *)SDL_iconv_string("UCS-4","UTF-8",&ucs4,sVar3 + 1);
      sVar4 = widelen(pcVar2);
      sVar3 = (sVar4 + 1) * 4;
      for (file._4_4_ = 0; file._4_4_ < 0xc; file._4_4_ = file._4_4_ + 1) {
        __ptr = (void *)SDL_iconv_string(formats[(long)(int)file._4_4_ + -1],"UCS-4",pcVar2,sVar3);
        __s1 = (void *)SDL_iconv_string("UCS-4",formats[(long)(int)file._4_4_ + -1],__ptr,sVar3);
        if ((__s1 == (void *)0x0) || (iVar1 = memcmp(__s1,pcVar2,sVar3), iVar1 != 0)) {
          fprintf(_stderr,"FAIL: %s\n",formats[(long)(int)file._4_4_ + -1]);
          len._4_4_ = len._4_4_ + 1;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        if (__s1 != (void *)0x0) {
          free(__s1);
        }
      }
      __s = (char *)SDL_iconv_string("UTF-8","UCS-4",pcVar2,sVar3);
      free(pcVar2);
      fputs(__s,_stdout);
      free(__s);
    }
    fprintf(_stderr,"\nTotal errors: %d\n",(ulong)len._4_4_);
    if (len._4_4_ == 0) {
      local_20dc = 0;
    }
    else {
      local_20dc = len._4_4_ + 1;
    }
    argv_local._4_4_ = local_20dc;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	const char * formats[] = {
		"UTF8",
		"UTF-8",
		"UTF16BE",
		"UTF-16BE",
		"UTF16LE",
		"UTF-16LE",
		"UTF32BE",
		"UTF-32BE",
		"UTF32LE",
		"UTF-32LE",
		"UCS4",
		"UCS-4",
	};

	const char * fname;
	char buffer[BUFSIZ];
	char *ucs4;
	char *test[2];
	int i;
	FILE *file;
	int errors = 0;

	fname = (argc < 2) ? "utf8.txt" : argv[1];
	file = fopen(fname, "rb");
	if ( !file ) {
		fprintf(stderr, "Unable to open %s\n", fname);
		return (1);
	}

	while ( fgets(buffer, sizeof(buffer), file) ) {
		/* Convert to UCS-4 */
		size_t len;
		ucs4 = SDL_iconv_string("UCS-4", "UTF-8", buffer, SDL_strlen(buffer)+1);
		len = (widelen(ucs4)+1)*4;
		for ( i = 0; i < SDL_arraysize(formats); ++i ) {
			test[0] = SDL_iconv_string(formats[i], "UCS-4", ucs4, len);
			test[1] = SDL_iconv_string("UCS-4", formats[i], test[0], len);
			if ( !test[1] || SDL_memcmp(test[1], ucs4, len) != 0 ) {
				fprintf(stderr, "FAIL: %s\n", formats[i]);
				++errors;
			}
			if ( test[0] ) {
				SDL_free(test[0]);
			}
			if ( test[1] ) {
				SDL_free(test[1]);
			}
		}
		test[0] = SDL_iconv_string("UTF-8", "UCS-4", ucs4, len);
		SDL_free(ucs4);
		fputs(test[0], stdout);
		SDL_free(test[0]);
	}

	fprintf(stderr, "\nTotal errors: %d\n", errors);
	return (errors ? errors + 1 : 0);
}